

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void * nk_buffer_align(void *unaligned,nk_size align,nk_size *alignment,
                      nk_buffer_allocation_type type)

{
  void *local_30;
  void *memory;
  nk_buffer_allocation_type type_local;
  nk_size *alignment_local;
  nk_size align_local;
  void *unaligned_local;
  
  local_30 = unaligned;
  if ((type == NK_BUFFER_FRONT) || (type != NK_BUFFER_BACK)) {
    if (align == 0) {
      *alignment = 0;
    }
    else {
      local_30 = (void *)((long)unaligned + (align - 1) & (align - 1 ^ 0xffffffffffffffff));
      *alignment = (long)local_30 - (long)unaligned;
    }
  }
  else if (align == 0) {
    *alignment = 0;
  }
  else {
    local_30 = (void *)((ulong)unaligned & (align - 1 ^ 0xffffffffffffffff));
    *alignment = (long)unaligned - (long)local_30;
  }
  return local_30;
}

Assistant:

NK_INTERN void*
nk_buffer_align(void *unaligned, nk_size align, nk_size *alignment,
    enum nk_buffer_allocation_type type)
{
    void *memory = 0;
    switch (type) {
    default:
    case NK_BUFFER_MAX:
    case NK_BUFFER_FRONT:
        if (align) {
            memory = NK_ALIGN_PTR(unaligned, align);
            *alignment = (nk_size)((nk_byte*)memory - (nk_byte*)unaligned);
        } else {
            memory = unaligned;
            *alignment = 0;
        }
        break;
    case NK_BUFFER_BACK:
        if (align) {
            memory = NK_ALIGN_PTR_BACK(unaligned, align);
            *alignment = (nk_size)((nk_byte*)unaligned - (nk_byte*)memory);
        } else {
            memory = unaligned;
            *alignment = 0;
        }
        break;
    }
    return memory;
}